

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_LZWDecoder.cc
# Opt level: O1

ssize_t __thiscall Pl_LZWDecoder::write(Pl_LZWDecoder *this,int __fd,void *__buf,size_t __n)

{
  uchar uVar1;
  uint uVar2;
  ulong in_RAX;
  ulong extraout_RAX;
  undefined4 in_register_00000034;
  void *pvVar3;
  
  if (__buf != (void *)0x0) {
    pvVar3 = (void *)0x0;
    do {
      uVar1 = *(uchar *)(CONCAT44(in_register_00000034,__fd) + (long)pvVar3);
      uVar2 = this->next_char_;
      this->next_char_ = uVar2 + 1;
      this->buf[uVar2] = uVar1;
      if (this->next_char_ == 3) {
        this->next_char_ = 0;
      }
      uVar2 = this->bits_available + 8;
      in_RAX = (ulong)uVar2;
      this->bits_available = uVar2;
      if (this->code_size <= uVar2) {
        sendNextCode(this);
        in_RAX = extraout_RAX;
      }
      pvVar3 = (void *)((long)pvVar3 + 1);
    } while (__buf != pvVar3);
  }
  return in_RAX;
}

Assistant:

void
Pl_LZWDecoder::write(unsigned char const* bytes, size_t len)
{
    for (size_t i = 0; i < len; ++i) {
        buf[next_char_++] = bytes[i];
        if (next_char_ == 3) {
            next_char_ = 0;
        }
        this->bits_available += 8;
        if (this->bits_available >= this->code_size) {
            sendNextCode();
        }
    }
}